

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O3

void __thiscall amrex::MLMG::actualBottomSolve(MLMG *this)

{
  BottomSolver BVar1;
  MLLinOp *pMVar2;
  pointer pdVar3;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> _Var4;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> _Var5;
  undefined4 extraout_var;
  Type type;
  long lVar6;
  ulong uVar7;
  Any *x;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> *mf;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> *p_Var12;
  double dVar13;
  Any raii_b;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> local_60;
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> local_58;
  BottomSolver local_4c;
  double local_48;
  undefined8 local_40 [2];
  
  local_48 = second();
  local_40[0] = CONCAT44(local_40[0]._4_4_,this->linop->m_bottom_comm);
  std::vector<amrex::ParallelContext::Frame,std::allocator<amrex::ParallelContext::Frame>>::
  emplace_back<int&>((vector<amrex::ParallelContext::Frame,std::allocator<amrex::ParallelContext::Frame>>
                      *)&ParallelContext::frames,(int *)local_40);
  pMVar2 = this->linop;
  lVar9 = (long)*(pMVar2->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
  lVar6 = lVar9 * 8 + -8;
  uVar10 = lVar9 - 1;
  uVar7 = uVar10 & 0xffffffff;
  x = (Any *)(*(long *)&(((this->cor).
                          super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                          .
                          super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar6);
  p_Var12 = (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)
            (lVar6 + *(long *)&(((this->res).
                                 super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
  (*pMVar2->_vptr_MLLinOp[0x2e])(pMVar2,x);
  if (this->bottom_solver == smoother) {
    if (0 < this->nuf) {
      iVar11 = 0;
      uVar8 = 1;
      do {
        uVar10 = (ulong)uVar8;
        uVar8 = 0;
        (*this->linop->_vptr_MLLinOp[0x39])(this->linop,0,uVar7,x,p_Var12,uVar10);
        iVar11 = iVar11 + 1;
      } while (iVar11 < this->nuf);
    }
  }
  else {
    local_60._M_head_impl = (innards_base *)operator_new(0x10);
    (local_60._M_head_impl)->_vptr_innards_base = (_func_int **)&PTR_Type_0080e330;
    *(undefined4 *)&local_60._M_head_impl[1]._vptr_innards_base = 0;
    iVar11 = (*this->linop->_vptr_MLLinOp[0x1f])();
    mf = p_Var12;
    if (((char)iVar11 != '\0') && (pMVar2 = this->linop, pMVar2->enforceSingularSolvable == true)) {
      iVar11 = (*pMVar2->_vptr_MLLinOp[0x2b])(pMVar2,p_Var12);
      local_40[0] = CONCAT44(extraout_var,iVar11);
      (*this->linop->_vptr_MLLinOp[0x27])(&local_58,this->linop,0,uVar7);
      _Var5._M_head_impl = local_58._M_head_impl;
      _Var4._M_head_impl = local_60._M_head_impl;
      local_58._M_head_impl = (innards_base *)0x0;
      local_60._M_head_impl = _Var5._M_head_impl;
      if ((_Var4._M_head_impl != (innards_base *)0x0) &&
         ((*(_Var4._M_head_impl)->_vptr_innards_base[2])(),
         local_58._M_head_impl != (innards_base *)0x0)) {
        (*(local_58._M_head_impl)->_vptr_innards_base[2])();
      }
      (*this->linop->_vptr_MLLinOp[0x2c])(this->linop,&local_60,p_Var12,local_40);
      mf = &local_60;
      makeSolvable(this,0,(int)uVar10,(Any *)mf);
    }
    type = CG;
    switch(this->bottom_solver) {
    default:
      type = BiCGStab;
    case cg:
    case cgbicg:
      iVar11 = bottomSolveWithCG(this,x,(Any *)mf,type);
      lVar6 = 0x18;
      if (iVar11 != 0) {
        (*this->linop->_vptr_MLLinOp[0x2e])
                  (this->linop,
                   *(long *)&(((this->cor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                             super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> +
                   uVar10 * 8);
        BVar1 = this->bottom_solver;
        lVar6 = 0x14;
        if ((BVar1 & ~smoother) == bicgcg) {
          local_4c = BVar1;
          iVar11 = bottomSolveWithCG(this,x,(Any *)mf,(uint)(BVar1 != cgbicg));
          if (iVar11 == 0) {
            this->bottom_solver = local_4c != cgbicg | bicgstab;
            lVar6 = 0x18;
          }
          else {
            (*this->linop->_vptr_MLLinOp[0x2e])
                      (this->linop,
                       uVar10 * 8 +
                       *(long *)&(((this->cor).
                                   super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                   .
                                   super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>);
            lVar6 = 0x14;
          }
        }
      }
      iVar11 = *(int *)((long)&this->verbose + lVar6);
      if (0 < iVar11) {
        do {
          (*this->linop->_vptr_MLLinOp[0x39])(this->linop,0,uVar7,x,p_Var12,0);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      break;
    case hypre:
      break;
    case petsc:
      Abort_host("bottomSolveWithPETSc is called without building with PETSc");
    }
    if (local_60._M_head_impl != (innards_base *)0x0) {
      (*(local_60._M_head_impl)->_vptr_innards_base[2])();
    }
  }
  DAT_00816950 = DAT_00816950 + -1;
  ParallelContext::Frame::~Frame(DAT_00816950);
  dVar13 = second();
  pdVar3 = (this->timer).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3[2] = (dVar13 - local_48) + pdVar3[2];
  return;
}

Assistant:

void
MLMG::actualBottomSolve ()
{
    BL_PROFILE("MLMG::actualBottomSolve()");

    if (!linop.isBottomActive()) return;

    auto bottom_start_time = amrex::second();

    ParallelContext::push(linop.BottomCommunicator());

    const int amrlev = 0;
    const int mglev = linop.NMGLevels(amrlev) - 1;
    auto& x = cor[amrlev][mglev];
    auto& b = res[amrlev][mglev];

    linop.AnySetToZero(x);

    if (bottom_solver == BottomSolver::smoother)
    {
        bool skip_fillboundary = true;
        for (int i = 0; i < nuf; ++i) {
            linop.AnySmooth(amrlev, mglev, x, b, skip_fillboundary);
            skip_fillboundary = false;
        }
    }
    else
    {
        Any* bottom_b = &b;
        Any raii_b;
        if (linop.isBottomSingular() && linop.getEnforceSingularSolvable())
        {
            const IntVect ng = linop.AnyGrowVect(b);
            raii_b = linop.AnyMake(amrlev, mglev, ng);
            linop.AnyCopy(raii_b, b, ng);
            bottom_b = &raii_b;

            makeSolvable(amrlev,mglev,*bottom_b);
        }

        if (bottom_solver == BottomSolver::hypre)
        {
#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
            bottomSolveWithHypre(x, *bottom_b);
#endif
        }
        else if (bottom_solver == BottomSolver::petsc)
        {
            bottomSolveWithPETSc(x, *bottom_b);
        }
        else
        {
            MLCGSolver::Type cg_type;
            if (bottom_solver == BottomSolver::cg ||
                bottom_solver == BottomSolver::cgbicg) {
                cg_type = MLCGSolver::Type::CG;
            } else {
                cg_type = MLCGSolver::Type::BiCGStab;
            }
            int ret = bottomSolveWithCG(x, *bottom_b, cg_type);
            // If the MLMG solve failed then set the correction to zero
            if (ret != 0) {
                linop.AnySetToZero(cor[amrlev][mglev]);
                if (bottom_solver == BottomSolver::cgbicg ||
                    bottom_solver == BottomSolver::bicgcg) {
                    if (bottom_solver == BottomSolver::cgbicg) {
                        cg_type = MLCGSolver::Type::BiCGStab; // switch to bicg
                    } else {
                        cg_type = MLCGSolver::Type::CG; // switch to cg
                    }
                    ret = bottomSolveWithCG(x, *bottom_b, cg_type);
                    if (ret != 0) {
                        linop.AnySetToZero(cor[amrlev][mglev]);
                    } else { // switch permanently
                        if (cg_type == MLCGSolver::Type::CG) {
                            bottom_solver = BottomSolver::cg;
                        } else {
                            bottom_solver = BottomSolver::bicgstab;
                        }
                    }
                }
            }
            const int n = (ret==0) ? nub : nuf;
            for (int i = 0; i < n; ++i) {
                linop.AnySmooth(amrlev, mglev, x, b);
            }
        }
    }

    ParallelContext::pop();

    timer[bottom_time] += amrex::second() - bottom_start_time;
}